

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

boolean inside_gas_cloud(void *p1,void *p2)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  
  iVar2 = *(int *)((long)p1 + 0x54);
  if (p2 != (void *)0x0) {
    lVar1 = *(long *)((long)p2 + 8);
    if (((*(char *)(lVar1 + 8) != '7') &&
        ((lVar1 != 0x3005f0 && *(char *)(lVar1 + 8) != '\x16') && (*(byte *)(lVar1 + 0x34) & 2) == 0
        )) && ((*(byte *)(lVar1 + 0x31) & 4) == 0)) {
      if ((viz_array[*(char *)((long)p2 + 0x50)][*(char *)((long)p2 + 0x4f)] & 2U) != 0) {
        pcVar4 = Monnam((monst *)p2);
        pline("%s coughs!",pcVar4);
      }
      setmangry((monst *)p2);
      if (((*(byte *)(*(long *)((long)p2 + 8) + 0x31) & 0x10) == 0) &&
         ((*(uint *)((long)p2 + 0x60) >> 0x11 & 1) != 0)) {
        *(undefined1 *)((long)p2 + 0x5b) = 1;
        *(uint *)((long)p2 + 0x60) = *(uint *)((long)p2 + 0x60) & 0xfffdffff;
      }
      if ((*(byte *)((long)p2 + 0x56) & 0x20) == 0) {
        iVar2 = rnd(iVar2);
        iVar2 = (*(int *)((long)p2 + 0x2c) - iVar2) + -5;
        *(int *)((long)p2 + 0x2c) = iVar2;
        if (iVar2 < 1) {
          if ((*(byte *)((long)p1 + 0x3e) & 2) == 0) {
            killed((monst *)p2);
          }
          else {
            monkilled((monst *)p2,"gas cloud",7);
          }
          if (*(int *)((long)p2 + 0x2c) < 1) {
            return '\x01';
          }
        }
      }
    }
    return '\0';
  }
  if ((youmonst.data)->mlet == '7') {
    return '\0';
  }
  if (((youmonst.data)->mflags2 & 2) != 0) {
    return '\0';
  }
  if ((youmonst.data)->mlet == '\x16') {
    return '\0';
  }
  if (youmonst.data == mons + 0x33) {
    return '\0';
  }
  if (u.uprops[0x31].intrinsic != 0) {
    return '\0';
  }
  if (u.uprops[0x31].extrinsic != 0) {
    return '\0';
  }
  uVar3 = (youmonst.data)->mflags1;
  if ((uVar3 >> 10 & 1) != 0) {
    return '\0';
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if (ublindf == (obj *)0x0) {
      if ((uVar3 >> 0xc & 1) != 0) goto LAB_00223f8f;
    }
    else if (((uVar3 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_00223f35;
  }
  else {
    if (ublindf == (obj *)0x0) goto LAB_00223f8f;
LAB_00223f35:
    if (ublindf->oartifact != '\x1d') goto LAB_00223f8f;
  }
  make_blinded(1,'\0');
LAB_00223f8f:
  if (((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) ||
      (((u.uprops[6].intrinsic >> 0x1a & 1) != 0 &&
       ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)))) &&
     (((byte)youmonst.mintrinsics & 0x20) == 0)) {
    pcVar4 = body_part(0x10);
    pcVar4 = makeplural(pcVar4);
    pline("Something is burning your %s!",pcVar4);
    pline("You cough and spit blood!");
    uVar3 = rnd(iVar2);
    if ((((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
        ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) &&
       (((byte)youmonst.mintrinsics & 0x20) == 0)) {
      uVar3 = uVar3 + 1 >> 1;
    }
    losehp(uVar3 + 5,"gas cloud",0);
    return '\0';
  }
  pline("You cough!");
  return '\0';
}

Assistant:

boolean inside_gas_cloud(void * p1, void * p2)
{
    struct region *reg;
    struct monst *mtmp;
    long dam;

    reg = (struct region *) p1;
    dam = (long) reg->arg;
    if (p2 == NULL) {		/* This means *YOU* Bozo! */
	if (nonliving(youmonst.data) || Breathless)
	    return FALSE;
	if (!Blind)
	    make_blinded(1L, FALSE);
	if (!FPoison_resistance) {
	    pline("Something is burning your %s!", makeplural(body_part(LUNG)));
	    pline("You cough and spit blood!");
	    dam = rnd(dam);
	    if (PPoison_resistance)
		dam = (dam + 1) / 2;
	    losehp(dam + 5, "gas cloud", KILLED_BY_AN);
	    return FALSE;
	} else {
	    pline("You cough!");
	    return FALSE;
	}
    } else {			/* A monster is inside the cloud */
	mtmp = (struct monst *) p2;

	/* Non living and non breathing monsters are not concerned */
	if (!nonliving(mtmp->data) && !breathless(mtmp->data)) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("%s coughs!", Monnam(mtmp));
	    setmangry(mtmp);
	    if (haseyes(mtmp->data) && mtmp->mcansee) {
		mtmp->mblinded = 1;
		mtmp->mcansee = 0;
	    }
	    if (resists_poison(mtmp))
		return FALSE;
	    mtmp->mhp -= rnd(dam) + 5;
	    if (mtmp->mhp <= 0) {
		if (heros_fault(reg))
		    killed(mtmp);
		else
		    monkilled(mtmp, "gas cloud", AD_DRST);
		if (mtmp->mhp <= 0) {	/* not lifesaved */
		    return TRUE;
		}
	    }
	}
    }
    return FALSE;		/* Monster is still alive */
}